

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_data_source_get_length_in_seconds(ma_data_source *pDataSource,float *pLength)

{
  ma_result mVar1;
  ma_uint32 sampleRate;
  ma_uint64 lengthInPCMFrames;
  
  if (pLength == (float *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    *pLength = 0.0;
    mVar1 = ma_data_source_get_length_in_pcm_frames(pDataSource,&lengthInPCMFrames);
    if (mVar1 == MA_SUCCESS) {
      mVar1 = ma_data_source_get_data_format
                        (pDataSource,(ma_format *)0x0,(ma_uint32 *)0x0,&sampleRate,(ma_channel *)0x0
                         ,0);
      if (mVar1 == MA_SUCCESS) {
        *pLength = (float)(long)lengthInPCMFrames / (float)sampleRate;
        mVar1 = MA_SUCCESS;
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_source_get_length_in_seconds(ma_data_source* pDataSource, float* pLength)
{
    ma_result result;
    ma_uint64 lengthInPCMFrames;
    ma_uint32 sampleRate;

    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    result = ma_data_source_get_length_in_pcm_frames(pDataSource, &lengthInPCMFrames);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* VC6 does not support division of unsigned 64-bit integers with floating point numbers. Need to use a signed number. This shouldn't effect anything in practice. */
    *pLength = (ma_int64)lengthInPCMFrames / (float)sampleRate;

    return MA_SUCCESS;
}